

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CTypeID lj_ctype_intern(CTState *cts,CTInfo info,CTSize size)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  uint in_EDX;
  uint in_ESI;
  lua_State *in_RDI;
  CType *ct;
  CTypeID id;
  uint32_t h;
  uint *in_stack_ffffffffffffffb8;
  ErrMsg em;
  uint uVar5;
  
  uVar2 = in_EDX << 0xe | in_EDX >> 0x12;
  uVar3 = (in_EDX ^ in_ESI) - uVar2;
  uVar2 = (uVar3 ^ (uVar2 << 5 | (in_EDX << 0xe) >> 0x1b)) - (uVar3 >> 0x13);
  uVar3 = uVar2 & 0x7f;
  uVar1 = *(ushort *)((long)&in_RDI[3].base + (ulong)uVar3 * 2);
  while( true ) {
    uVar5 = (uint)uVar1;
    if (uVar5 == 0) {
      uVar5 = (in_RDI->glref).ptr32;
      if ((in_RDI->gclist).gcptr32 <= uVar5) {
        em = (ErrMsg)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
        if (0xffff < uVar5) {
          lj_err_msg((lua_State *)(CONCAT44(uVar2,uVar5) & 0x7fffffffff),em);
        }
        pvVar4 = lj_mem_grow(in_RDI,(void *)CONCAT44(in_ESI,in_EDX),
                             (MSize *)(CONCAT44(uVar2,uVar5) & 0x7fffffffff),em,
                             (MSize)in_stack_ffffffffffffffb8);
        *(void **)in_RDI = pvVar4;
      }
      (in_RDI->glref).ptr32 = uVar5 + 1;
      *(uint *)(*(long *)in_RDI + (ulong)uVar5 * 0x10) = in_ESI;
      *(uint *)(*(long *)in_RDI + (ulong)uVar5 * 0x10 + 4) = in_EDX;
      *(undefined2 *)(*(long *)in_RDI + (ulong)uVar5 * 0x10 + 8) = 0;
      *(undefined2 *)(*(long *)in_RDI + (ulong)uVar5 * 0x10 + 10) =
           *(undefined2 *)((long)&in_RDI[3].base + (ulong)uVar3 * 2);
      *(undefined4 *)(*(long *)in_RDI + (ulong)uVar5 * 0x10 + 0xc) = 0;
      *(short *)((long)&in_RDI[3].base + (ulong)uVar3 * 2) = (short)uVar5;
      return uVar5;
    }
    in_stack_ffffffffffffffb8 = (uint *)(*(long *)in_RDI + (ulong)uVar5 * 0x10);
    if ((*in_stack_ffffffffffffffb8 == in_ESI) && (in_stack_ffffffffffffffb8[1] == in_EDX)) break;
    uVar1 = *(ushort *)((long)in_stack_ffffffffffffffb8 + 10);
  }
  return uVar5;
}

Assistant:

CTypeID lj_ctype_intern(CTState *cts, CTInfo info, CTSize size)
{
  uint32_t h = ct_hashtype(info, size);
  CTypeID id = cts->hash[h];
  lj_assertCTS(cts->L, "uninitialized cts->L");
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (ct->info == info && ct->size == size)
      return id;
    id = ct->next;
  }
  id = cts->top;
  if (LJ_UNLIKELY(id >= cts->sizetab)) {
#ifdef LUAJIT_CTYPE_CHECK_ANCHOR
    CType *ct;
#endif
    if (id >= CTID_MAX) lj_err_msg(cts->L, LJ_ERR_TABOV);
#ifdef LUAJIT_CTYPE_CHECK_ANCHOR
    ct = lj_mem_newvec(cts->L, id+1, CType);
    memcpy(ct, cts->tab, id*sizeof(CType));
    memset(cts->tab, 0, id*sizeof(CType));
    lj_mem_freevec(cts->g, cts->tab, cts->sizetab, CType);
    cts->tab = ct;
    cts->sizetab = id+1;
#else
    lj_mem_growvec(cts->L, cts->tab, cts->sizetab, CTID_MAX, CType);
#endif
  }
  cts->top = id+1;
  cts->tab[id].info = info;
  cts->tab[id].size = size;
  cts->tab[id].sib = 0;
  cts->tab[id].next = cts->hash[h];
  setgcrefnull(cts->tab[id].name);
  cts->hash[h] = (CTypeID1)id;
  return id;
}